

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

RegExp * __thiscall re2c::Scanner::cls(Scanner *this,Range *r)

{
  empty_class_policy_t eVar1;
  uint32_t uVar2;
  type_t tVar3;
  opt_t *poVar4;
  RegExp *this_00;
  Range *r_local;
  Scanner *this_local;
  
  if (r == (Range *)0x0) {
    poVar4 = Opt::operator->((Opt *)&opts);
    eVar1 = poVar4->empty_class_policy;
    if (eVar1 == EMPTY_CLASS_MATCH_EMPTY) {
      uVar2 = get_line(this);
      Warn::empty_class((Warn *)warn,uVar2);
      this_00 = (RegExp *)operator_new(8);
      NullOp::NullOp((NullOp *)this_00);
      return this_00;
    }
    if (eVar1 == EMPTY_CLASS_MATCH_NONE) {
      uVar2 = get_line(this);
      Warn::empty_class((Warn *)warn,uVar2);
    }
    else if (eVar1 == EMPTY_CLASS_ERROR) {
      fatal(this,"empty character class");
    }
  }
  poVar4 = Opt::operator->((Opt *)&opts);
  tVar3 = Enc::type(&poVar4->encoding);
  if (tVar3 == UTF16) {
    this_local = (Scanner *)UTF16Range(r);
  }
  else if (tVar3 == UTF8) {
    this_local = (Scanner *)UTF8Range(r);
  }
  else {
    this_local = (Scanner *)operator_new(0x10);
    MatchOp::MatchOp((MatchOp *)this_local,r);
  }
  return (RegExp *)this_local;
}

Assistant:

RegExp *Scanner::cls(Range *r) const
{
	if (!r)
	{
		switch (opts->empty_class_policy)
		{
			case EMPTY_CLASS_MATCH_EMPTY:
				warn.empty_class (get_line ());
				return new NullOp;
			case EMPTY_CLASS_MATCH_NONE:
				warn.empty_class (get_line ());
				break;
			case EMPTY_CLASS_ERROR:
				fatal ("empty character class");
				break;
		}
	}

	switch (opts->encoding.type ())
	{
		case Enc::UTF16: return UTF16Range(r);
		case Enc::UTF8:  return UTF8Range(r);
		default:         return new MatchOp(r);
	}
}